

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitArrayInit(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  ArrayInitOp op_00;
  mapped_type *pmVar1;
  Name *local_90;
  Name *local_88;
  string_view local_80;
  Builder local_70;
  ArrayInit *local_68;
  ArrayInit *built;
  Expression *local_58;
  Expression *ref;
  Expression *index;
  Expression *offset;
  Expression *size;
  HeapType HStack_30;
  Index segIdx;
  HeapType heapType;
  ArrayInitOp op;
  uint32_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  if (code == 0x54) {
    heapType.id._0_4_ = InitData;
  }
  else {
    if (code != 0x55) {
      return false;
    }
    heapType.id._0_4_ = InitElem;
  }
  heapType.id._4_4_ = code;
  HStack_30 = getIndexedHeapType(this);
  size._4_4_ = getU32LEB(this);
  offset = popNonVoidExpression(this);
  index = popNonVoidExpression(this);
  ref = popNonVoidExpression(this);
  local_58 = popNonVoidExpression(this);
  built = (ArrayInit *)HStack_30.id;
  validateHeapTypeUsingChild(this,local_58,HStack_30);
  Builder::Builder(&local_70,this->wasm);
  op_00 = (ArrayInitOp)heapType.id;
  wasm::Name::Name((Name *)&local_80);
  local_68 = Builder::makeArrayInit(&local_70,op_00,(Name)local_80,local_58,ref,index,offset);
  if ((ArrayInitOp)heapType.id == InitData) {
    pmVar1 = std::
             map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
             ::operator[](&this->dataRefs,(key_type *)((long)&size + 4));
    local_88 = &local_68->segment;
    std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>::push_back(pmVar1,&local_88);
  }
  else {
    pmVar1 = std::
             map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
             ::operator[](&this->elemRefs,(key_type *)((long)&size + 4));
    local_90 = &local_68->segment;
    std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>::push_back(pmVar1,&local_90);
  }
  *out = (Expression *)local_68;
  return true;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitArrayInit(Expression*& out, uint32_t code) {
  ArrayInitOp op;
  switch (code) {
    case BinaryConsts::ArrayInitData:
      op = InitData;
      break;
    case BinaryConsts::ArrayInitElem:
      op = InitElem;
      break;
    default:
      return false;
  }
  auto heapType = getIndexedHeapType();
  Index segIdx = getU32LEB();
  auto* size = popNonVoidExpression();
  auto* offset = popNonVoidExpression();
  auto* index = popNonVoidExpression();
  auto* ref = popNonVoidExpression();
  validateHeapTypeUsingChild(ref, heapType);
  auto* built =
    Builder(wasm).makeArrayInit(op, Name(), ref, index, offset, size);
  if (op == InitData) {
    dataRefs[segIdx].push_back(&built->segment);
  } else {
    elemRefs[segIdx].push_back(&built->segment);
  }
  out = built;
  return true;
}